

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O1

bool dg::llvmdg::anon_unknown_2::callIsCompatible(Function *F,CallInst *CI,CallCompatibility policy)

{
  int iVar1;
  long *plVar2;
  Type *pTVar3;
  char cVar4;
  bool bVar5;
  op_iterator pUVar6;
  CallInst *pCVar7;
  long *plVar8;
  long *plVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  
  pUVar6 = llvm::CallBase::arg_end(&CI->super_CallBase);
  iVar1 = *(int *)&(CI->super_CallBase).field_0x14;
  if ((((ulong)(pUVar6 + ((ulong)(uint)(iVar1 << 5) - (long)CI)) >> 5 & 0xffffffff) <
       *(ulong *)(F + 0x60)) ||
     ((cVar4 = llvm::Type::canLosslesslyBitCastTo
                         ((Type *)**(undefined8 **)(*(long *)(F + 0x18) + 0x10)), cVar4 == '\0' &&
      (((*(uint *)(**(long **)(*(long *)(F + 0x18) + 0x10) + 8) & 0xfd) != 0xd ||
       ((*(uint *)(*(long *)&CI->super_CallBase + 8) & 0xfd) != 0xd)))))) {
LAB_00120f4a:
    bVar5 = false;
  }
  else {
    if (((byte)F[0x12] & 1) != 0) {
      llvm::Function::BuildLazyArguments();
    }
    plVar2 = *(long **)(F + 0x58);
    if (((byte)F[0x12] & 1) != 0) {
      llvm::Function::BuildLazyArguments();
    }
    plVar9 = (long *)(*(long *)(F + 0x60) * 0x28 + *(long *)(F + 0x58));
    uVar11 = (ulong)(pUVar6 + ((ulong)(uint)(iVar1 << 5) - (long)CI)) >> 5 & 0xffffffff;
    bVar5 = plVar2 == plVar9 || uVar11 == 0;
    if (plVar2 != plVar9 && uVar11 != 0) {
      uVar10 = 1;
      pCVar7 = CI;
      do {
        plVar8 = plVar2 + 5;
        pTVar3 = (Type *)**(undefined8 **)
                           ((long)pCVar7 -
                           (ulong)(uint)(*(int *)&(CI->super_CallBase).field_0x14 << 5));
        if ((((*(uint *)(pTVar3 + 8) & 0xfd) != 0xd) || ((*(uint *)(*plVar2 + 8) & 0xfd) != 0xd)) &&
           (cVar4 = llvm::Type::canLosslesslyBitCastTo(pTVar3), cVar4 == '\0')) goto LAB_00120f4a;
        bVar12 = uVar11 <= uVar10;
        bVar5 = plVar8 == plVar9 || bVar12;
        pCVar7 = (CallInst *)&(pCVar7->super_CallBase).field_0x20;
        uVar10 = uVar10 + 1;
        plVar2 = plVar8;
      } while (plVar8 != plVar9 && !bVar12);
    }
  }
  return bVar5;
}

Assistant:

inline bool
callIsCompatible(const llvm::Function *F, const llvm::CallInst *CI,
                 CallCompatibility policy = CallCompatibility::LOOSE) {
    using namespace llvm;

#if LLVM_VERSION_MAJOR >= 8
    auto max_idx = CI->arg_size();
#else
    auto max_idx = CI->getNumArgOperands();
#endif

    if (policy != CallCompatibility::MATCHING_ARGS) {
        if (F->isVarArg()) {
            if (F->arg_size() > max_idx) {
                return false;
            }
        } else if (F->arg_size() != max_idx) {
            if (policy == CallCompatibility::STRICT ||
                F->arg_size() > max_idx) {
                // too few arguments
                return false;
            }
        }

        if (!F->getReturnType()->canLosslesslyBitCastTo(CI->getType())) {
            // it showed up that the loosless bitcast is too strict
            // alternative since we can use the constexpr castings
            if (!(isPointerOrIntegerTy(F->getReturnType()) &&
                  isPointerOrIntegerTy(CI->getType()))) {
                return false;
            }
        }
    }

    size_t idx = 0;
    for (auto A = F->arg_begin(), E = F->arg_end(); idx < max_idx && A != E;
         ++A, ++idx) {
        Type *CTy = CI->getArgOperand(idx)->getType();
        Type *ATy = A->getType();

        if (!(isPointerOrIntegerTy(CTy) && isPointerOrIntegerTy(ATy)))
            if (!CTy->canLosslesslyBitCastTo(ATy)) {
                return false;
            }
    }

    return true;
}